

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O2

void rw::wdgl::printPipeinfo(Atomic *a)

{
  Geometry *pGVar1;
  InstanceDataHeader *pIVar2;
  long lVar3;
  ulong uVar4;
  int i;
  long lVar5;
  long lVar6;
  
  pGVar1 = a->geometry;
  pIVar2 = pGVar1->instData;
  if ((pIVar2 != (InstanceDataHeader *)0x0) && (pIVar2->platform == 0xb)) {
    if (a->pipeline == (ObjPipeline *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)(a->pipeline->super_Pipeline).pluginID;
    }
    printf("%s %x: ",debugFile,uVar4);
    pIVar2 = pGVar1->instData;
    lVar6 = 4;
    for (lVar5 = 0; lVar5 < (int)pIVar2[1].platform; lVar5 = lVar5 + 1) {
      lVar3 = *(long *)(pIVar2 + 2);
      printf("%x(%x) ",(ulong)*(uint *)(lVar3 + -4 + lVar6),(ulong)*(uint *)(lVar3 + lVar6));
      lVar6 = lVar6 + 0x18;
    }
    putchar(10);
    return;
  }
  return;
}

Assistant:

void
printPipeinfo(Atomic *a)
{
	Geometry *g = a->geometry;
	if(g->instData == nil || g->instData->platform != PLATFORM_WDGL)
		return;
	int32 plgid = 0;
	if(a->pipeline)
		plgid = a->pipeline->pluginID;
	printf("%s %x: ", debugFile, plgid);
	InstanceDataHeader *h = (InstanceDataHeader*)g->instData;
	for(int i = 0; i < h->numAttribs; i++)
		printf("%x(%x) ", h->attribs[i].index, h->attribs[i].type);
	printf("\n");
}